

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O3

void __thiscall
OctreeBuilder::create_descriptors(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  DescriptorSet *pDVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _func_int **pp_Var7;
  element_type *peVar8;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  allocator_type local_c9;
  undefined1 local_c8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  DescriptorSet local_98;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_c8._32_8_ = (element_type *)0x500000007;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_c8 + 0x20);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_98,__l,
             &local_c9);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)local_c8,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_98);
  uVar5 = local_c8._8_8_;
  uVar4 = local_c8._0_8_;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  p_Var1 = (this->m_descriptor_pool).
           super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((pointer)local_c8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  if (local_98.super_DeviceObjectBase.super_Base._vptr_Base != (_func_int **)0x0) {
    operator_delete(local_98.super_DeviceObjectBase.super_Base._vptr_Base,
                    (long)local_98.super_DeviceObjectBase.super_Base.
                          super_enable_shared_from_this<myvk::Base>._M_weak_this.
                          super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    - (long)local_98.super_DeviceObjectBase.super_Base._vptr_Base);
  }
  local_98.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x700000000;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x2000000001;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x700000001;
  local_98.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2000000001;
  local_98.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x700000002;
  local_98.m_descriptor_set = (VkDescriptorSet)0x2000000001;
  local_58 = 0;
  local_50 = 0x700000003;
  uStack_48 = 0x2000000001;
  local_40 = 0;
  local_38 = 0x700000004;
  uStack_30 = 0x2000000001;
  local_28 = 0;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_98;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_c8,__l_00,(allocator_type *)&local_c9);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)(local_c8 + 0x20),device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_c8);
  p_Var6 = p_Stack_a0;
  uVar4 = local_c8._32_8_;
  local_c8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_descriptor_set_layout).
           super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
    }
  }
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  myvk::DescriptorSet::Create(&local_98,&this->m_descriptor_pool,&this->m_descriptor_set_layout);
  peVar8 = local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var7 = local_98.super_DeviceObjectBase.super_Base._vptr_Base;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var7;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
        _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  pDVar2 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)
       (this->m_atomic_counter).m_buffer.
       super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->m_atomic_counter).m_buffer.
       super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (pDVar2,(Ptr<BufferBase> *)&local_98,0,0,0,0xffffffffffffffff);
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pDVar2 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)
       (this->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (pDVar2,(Ptr<BufferBase> *)&local_98,1,0,0,0xffffffffffffffff);
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pDVar2 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3 = (this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)
       (peVar3->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (peVar3->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (pDVar2,(Ptr<BufferBase> *)&local_98,2,0,0,0xffffffffffffffff);
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pDVar2 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)
       (this->m_build_info_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->m_build_info_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (pDVar2,(Ptr<BufferBase> *)&local_98,3,0,0,0xffffffffffffffff);
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pDVar2 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)
       (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_enable_shared_from_this<myvk::Base>)._M_weak_this.
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&((local_98.super_DeviceObjectBase.super_Base.
                      super_enable_shared_from_this<myvk::Base>._M_weak_this.
                      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (pDVar2,(Ptr<BufferBase> *)&local_98,4,0,0,0xffffffffffffffff);
  if (local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void OctreeBuilder::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 5}});
	{
		VkDescriptorSetLayoutBinding atomic_counter_binding = {};
		atomic_counter_binding.binding = 0;
		atomic_counter_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		atomic_counter_binding.descriptorCount = 1;
		atomic_counter_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding octree_binding = {};
		octree_binding.binding = 1;
		octree_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		octree_binding.descriptorCount = 1;
		octree_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding fragment_list_binding = {};
		fragment_list_binding.binding = 2;
		fragment_list_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		fragment_list_binding.descriptorCount = 1;
		fragment_list_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding build_info_binding = {};
		build_info_binding.binding = 3;
		build_info_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		build_info_binding.descriptorCount = 1;
		build_info_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		VkDescriptorSetLayoutBinding indirect_binding = {};
		indirect_binding.binding = 4;
		indirect_binding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
		indirect_binding.descriptorCount = 1;
		indirect_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;

		m_descriptor_set_layout =
		    myvk::DescriptorSetLayout::Create(device, {atomic_counter_binding, octree_binding, fragment_list_binding,
		                                               build_info_binding, indirect_binding});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
	m_descriptor_set->UpdateStorageBuffer(m_atomic_counter.GetBuffer(), 0);
	m_descriptor_set->UpdateStorageBuffer(m_octree_buffer, 1);
	m_descriptor_set->UpdateStorageBuffer(m_voxelizer_ptr->GetVoxelFragmentList(), 2);
	m_descriptor_set->UpdateStorageBuffer(m_build_info_buffer, 3);
	m_descriptor_set->UpdateStorageBuffer(m_indirect_buffer, 4);
}